

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O3

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_last_of
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> *v,size_type pos)

{
  ulong uVar1;
  const_pointer pcVar2;
  const_pointer pcVar3;
  const_pointer pcVar4;
  size_type sVar5;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  uVar1 = this->size_;
  if (uVar1 == 0) {
    return 0xffffffffffffffff;
  }
  if (pos < uVar1) {
    pcVar2 = this->data_;
    pcVar3 = pcVar2 + pos + 1;
    pcVar4 = pcVar2;
    if (pcVar3 != pcVar2) {
      do {
        if (v->size_ != 0) {
          sVar5 = 0;
          do {
            pcVar4 = pcVar3;
            if (pcVar3[-1] == v->data_[sVar5]) goto LAB_001bf07f;
            sVar5 = sVar5 + 1;
          } while (v->size_ != sVar5);
        }
        pcVar3 = pcVar3 + -1;
        pcVar4 = pcVar2;
      } while (pcVar3 != pcVar2);
    }
LAB_001bf07f:
    pcVar3 = (const_pointer)0xffffffffffffffff;
    if (pcVar4 != pcVar2) {
      pcVar3 = pcVar4 + ~(ulong)pcVar2;
    }
  }
  else {
    local_10.data_ = v->data_;
    local_10.size_ = v->size_;
    pcVar3 = (const_pointer)find_last_of(this,&local_10,uVar1 - 1);
  }
  return (size_type)pcVar3;
}

Assistant:

nssv_constexpr size_type find_last_of( basic_string_view v, size_type pos = npos ) const nssv_noexcept  // (1)
    {
        return empty()
            ? npos
            : pos >= size()
            ? find_last_of( v, size() - 1 )
            : to_pos( std::find_first_of( const_reverse_iterator( cbegin() + pos + 1 ), crend(), v.cbegin(), v.cend(), Traits::eq ) );
    }